

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_TriangleStripSet(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  size_type sVar7;
  DeadlyImportError *pDVar8;
  CX3DImporter_NodeElement_Set *pCVar9;
  reference piVar10;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  byte local_175;
  value_type_conflict1 local_174;
  value_type_conflict1 vStack_170;
  bool close_found;
  value_type_conflict1 local_16c;
  value_type_conflict1 local_168;
  value_type_conflict1 local_164;
  value_type_conflict1 local_160;
  value_type_conflict1 local_15c;
  int local_158;
  undefined1 local_152;
  allocator local_151;
  int32_t vc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_130;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_128;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_120;
  const_iterator vc_it;
  size_t coord_num_sb;
  value_type_conflict1 vStack_108;
  bool odd_tri;
  size_t coord_num2;
  size_t coord_num1;
  size_t coord_num0;
  CX3DImporter_NodeElement_Set *ne_alias;
  string local_e0;
  undefined4 local_c0;
  allocator local_b9;
  undefined1 local_b8 [8];
  string an;
  uint local_84;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  undefined1 local_70 [6];
  bool solid;
  bool normalPerVertex;
  vector<int,_std::allocator<int>_> stripCount;
  string local_50 [6];
  bool colorPerVertex;
  bool ccw;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  stripCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  stripCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_70);
  ne._7_1_ = 1;
  ne._6_1_ = 1;
  _idx_end = (CX3DImporter_NodeElement_Set *)0x0;
  local_84 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_84 < iVar2; local_84 = local_84 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_84);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_b8,(char *)CONCAT44(extraout_var,iVar3),&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_84);
      std::__cxx11::string::operator=(local_50,(char *)CONCAT44(extraout_var_00,iVar3));
      local_c0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_84);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        local_c0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"bboxCenter");
        if (bVar1) {
          local_c0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"bboxSize");
          if (bVar1) {
            local_c0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"containerField");
            if (bVar1) {
              local_c0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8,"ccw");
              if (bVar1) {
                stripCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ =
                     XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                local_c0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8,"colorPerVertex");
                if (bVar1) {
                  stripCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._6_1_ =
                       XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                  local_c0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b8,"stripCount");
                  if (bVar1) {
                    XML_ReadNode_GetAttrVal_AsArrI32
                              (this,local_84,(vector<int,_std::allocator<int>_> *)local_70);
                    local_c0 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_b8,"normalPerVertex");
                    if (bVar1) {
                      ne._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                      local_c0 = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_b8,"solid");
                      if (bVar1) {
                        ne._6_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                        local_c0 = 4;
                      }
                      else {
                        Throw_IncorrectAttr(this,(string *)local_b8);
                        local_c0 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_b8);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_TriangleStripSet,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_70);
    if (sVar7 == 0) {
      ne_alias._6_1_ = 1;
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,
                 "TriangleStripSet must contain not empty \"stripCount\" attribute.",
                 (allocator *)((long)&ne_alias + 7));
      DeadlyImportError::DeadlyImportError(pDVar8,&local_e0);
      ne_alias._6_1_ = 0;
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pCVar9 = (CX3DImporter_NodeElement_Set *)operator_new(0xd8);
    CX3DImporter_NodeElement_Set::CX3DImporter_NodeElement_Set
              (pCVar9,ENET_TriangleStripSet,this->NodeElement_Cur);
    _idx_end = pCVar9;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID,local_50);
    }
    pCVar9 = _idx_end;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x71 =
         stripCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._7_1_ & 1;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x72 =
         stripCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._6_1_ & 1;
    std::vector<int,_std::allocator<int>_>::operator=
              (&_idx_end->VertexCount,(vector<int,_std::allocator<int>_> *)local_70);
    (pCVar9->super_CX3DImporter_NodeElement_Geometry3D).field_0x73 = ne._7_1_ & 1;
    (pCVar9->super_CX3DImporter_NodeElement_Geometry3D).Solid = (bool)(ne._6_1_ & 1);
    std::vector<int,_std::allocator<int>_>::clear(&pCVar9->CoordIndex);
    vc_it._M_current = (int *)0x0;
    local_128._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(&pCVar9->VertexCount);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_120,
               &local_128);
    while( true ) {
      local_130._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end(&pCVar9->VertexCount);
      bVar1 = __gnu_cxx::operator!=(&local_120,&local_130);
      if (!bVar1) break;
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_120);
      if (*piVar10 < 3) {
        local_152 = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&vc,
                   "TriangleStripSet. stripCount shall be greater than or equal to three.",
                   &local_151);
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)&vc);
        local_152 = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      coord_num1 = (size_t)vc_it._M_current;
      coord_num2 = (long)vc_it._M_current + 1;
      _vStack_108 = vc_it._M_current + 2;
      bVar1 = true;
      for (local_158 = 2; iVar2 = local_158,
          piVar10 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_120), iVar2 < *piVar10; local_158 = local_158 + 1) {
        if ((stripCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          local_168 = (value_type_conflict1)coord_num1;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_168);
          local_16c = vStack_108;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_16c);
          vStack_170 = (value_type_conflict1)coord_num2;
          std::vector<int,_std::allocator<int>_>::push_back
                    (&pCVar9->CoordIndex,&stack0xfffffffffffffe90);
        }
        else {
          local_15c = (value_type_conflict1)coord_num1;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_15c);
          local_160 = (value_type_conflict1)coord_num2;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_160);
          local_164 = vStack_108;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_164);
        }
        local_174 = -1;
        std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_174);
        if (bVar1) {
          coord_num1 = (size_t)_vStack_108;
        }
        else {
          coord_num2 = (size_t)_vStack_108;
        }
        _vStack_108 = (int *)((long)_vStack_108 + 1);
        bVar1 = (bool)(bVar1 ^ 1);
        vc_it._M_current = _vStack_108;
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_120);
    }
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) == 0) {
      ParseHelper_Node_Enter(this,(CX3DImporter_NodeElement *)_idx_end);
      local_175 = 0;
      do {
        do {
          while( true ) {
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])
                              ();
            if ((uVar4 & 1) == 0) goto LAB_00c36869;
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])
                              ();
            if (iVar2 != 1) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_198,"Color",&local_199);
            bVar1 = XML_CheckNode_NameEqual(this,&local_198);
            std::__cxx11::string::~string((string *)&local_198);
            std::allocator<char>::~allocator((allocator<char> *)&local_199);
            if (bVar1) {
              ParseNode_Rendering_Color(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_1c0,"ColorRGBA",&local_1c1);
              bVar1 = XML_CheckNode_NameEqual(this,&local_1c0);
              std::__cxx11::string::~string((string *)&local_1c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
              if (bVar1) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_1e8,"Coordinate",&local_1e9);
                bVar1 = XML_CheckNode_NameEqual(this,&local_1e8);
                std::__cxx11::string::~string((string *)&local_1e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
                if (bVar1) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_210,"Normal",&local_211);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_210);
                  std::__cxx11::string::~string((string *)&local_210);
                  std::allocator<char>::~allocator((allocator<char> *)&local_211);
                  if (bVar1) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_238,"TextureCoordinate",&local_239);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_238);
                    std::__cxx11::string::~string((string *)&local_238);
                    std::allocator<char>::~allocator((allocator<char> *)&local_239);
                    if (bVar1) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_260,"TriangleStripSet",&local_261);
                        XML_CheckNode_SkipUnsupported(this,&local_260);
                        std::__cxx11::string::~string((string *)&local_260);
                        std::allocator<char>::~allocator((allocator<char> *)&local_261);
                      }
                    }
                  }
                }
              }
            }
          }
          pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])()
          ;
        } while (iVar2 != 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_288,"TriangleStripSet",&local_289);
        bVar1 = XML_CheckNode_NameEqual(this,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator((allocator<char> *)&local_289);
      } while (!bVar1);
      local_175 = 1;
LAB_00c36869:
      if ((local_175 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2b0,"TriangleStripSet",&local_2b1);
        Throw_CloseNotFound(this,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_TriangleStripSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> stripCount;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("stripCount", stripCount, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleStripSet, ne);
	}
	else
	{
		// check data
		if(stripCount.size() == 0) throw DeadlyImportError("TriangleStripSet must contain not empty \"stripCount\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Set(CX3DImporter_NodeElement::ENET_TriangleStripSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_Set& ne_alias = *((CX3DImporter_NodeElement_Set*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.VertexCount = stripCount;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
		// create CoordIdx
		size_t coord_num0, coord_num1, coord_num2;// indices of current triangle
		bool odd_tri;// sequence of current triangle
		size_t coord_num_sb;// index of first point of strip

		ne_alias.CoordIndex.clear();
		coord_num_sb = 0;
		for(std::vector<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); ++vc_it)
		{
			if(*vc_it < 3) throw DeadlyImportError("TriangleStripSet. stripCount shall be greater than or equal to three.");

			// set initial values for first triangle
			coord_num0 = coord_num_sb;
			coord_num1 = coord_num_sb + 1;
			coord_num2 = coord_num_sb + 2;
			odd_tri = true;

			for(int32_t vc = 2; vc < *vc_it; vc++)
			{
				if(ccw)
				{
					// 0 2
					//  1
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num0));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num1));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num2));
				}
				else
				{
					// 0 1
					//  2
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num0));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num2));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num1));
				}// if(ccw) else

				ne_alias.CoordIndex.push_back(-1);// add face delimiter.
				// prepare values for next triangle
				if(odd_tri)
				{
					coord_num0 = coord_num2;
					coord_num2++;
				}
				else
				{
					coord_num1 = coord_num2;
					coord_num2 = coord_num1 + 1;
				}

				odd_tri = !odd_tri;
				coord_num_sb = coord_num2;// that index will be start of next strip
			}// for(int32_t vc = 2; vc < *vc_it; vc++)
		}// for(std::list<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); vc_it++)
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("TriangleStripSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("TriangleStripSet");

			MACRO_NODECHECK_LOOPEND("TriangleStripSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}